

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void output_rule_data(void)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  if (rflag == '\0') {
    fwrite("static ",7,1,(FILE *)output_file);
  }
  fprintf((FILE *)output_file,"int %slhs[] = {%42d,",symbol_prefix,
          (ulong)(uint)symbol_value[start_symbol]);
  if (3 < nrules) {
    iVar2 = 10;
    lVar3 = 3;
    do {
      if (iVar2 < 10) {
        iVar2 = iVar2 + 1;
      }
      else {
        if (rflag == '\0') {
          outline = outline + 1;
        }
        putc(10,(FILE *)output_file);
        iVar2 = 1;
      }
      fprintf((FILE *)output_file,"%5d,",(ulong)(uint)symbol_value[rlhs[lVar3]]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < nrules);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fwrite("\n};\n",4,1,(FILE *)output_file);
  if (rflag == '\0') {
    fwrite("static ",7,1,(FILE *)output_file);
  }
  fprintf((FILE *)output_file,"int %slen[] = {%42d,",symbol_prefix,2);
  if (3 < nrules) {
    iVar2 = 10;
    lVar3 = 3;
    do {
      if (iVar2 < 10) {
        iVar2 = iVar2 + 1;
      }
      else {
        if (rflag == '\0') {
          outline = outline + 1;
        }
        putc(10,(FILE *)output_file);
        iVar2 = 1;
      }
      lVar1 = lVar3 + 1;
      fprintf((FILE *)output_file,"%5d,",(ulong)(uint)(~rrhs[lVar3] + rrhs[lVar3 + 1]));
      lVar3 = lVar1;
    } while (lVar1 < nrules);
  }
  if (rflag == '\0') {
    outline = outline + 2;
  }
  fwrite("\n};\n",4,1,(FILE *)output_file);
  return;
}

Assistant:

void output_rule_data()
{
    register int i;
    register int j;

    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %slhs[] = {%42d,", symbol_prefix,
	    symbol_value[start_symbol]);

    j = 10;
    for (i = 3; i < nrules; i++)
    {
	if (j >= 10)
	{
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1;
	}
        else
	    ++j;

        fprintf(output_file, "%5d,", symbol_value[rlhs[i]]);
    }
    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");

    if (!rflag)
	fprintf(output_file, "static ");
    fprintf(output_file, "int %slen[] = {%42d,", symbol_prefix, 2);

    j = 10;
    for (i = 3; i < nrules; i++)
    {
	if (j >= 10)
	{
	    if (!rflag) ++outline;
	    putc('\n', output_file);
	    j = 1;
	}
	else
	  j++;

        fprintf(output_file, "%5d,", rrhs[i + 1] - rrhs[i] - 1);
    }
    if (!rflag) outline += 2;
    fprintf(output_file, "\n};\n");
}